

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O0

void __thiscall Deck::Deck(Deck *this,Deck *toCopy)

{
  int *piVar1;
  vector<CardType,_std::allocator<CardType>_> *pvVar2;
  Deck *toCopy_local;
  Deck *this_local;
  
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  this->deckSize = piVar1;
  pvVar2 = (vector<CardType,_std::allocator<CardType>_> *)operator_new(0x18);
  std::vector<CardType,_std::allocator<CardType>_>::vector(pvVar2);
  this->deckPointer = pvVar2;
  pvVar2 = (vector<CardType,_std::allocator<CardType>_> *)operator_new(0x18);
  std::vector<CardType,_std::allocator<CardType>_>::vector(pvVar2);
  this->discardPointer = pvVar2;
  *this->deckSize = *toCopy->deckSize;
  std::vector<CardType,_std::allocator<CardType>_>::operator=(this->deckPointer,toCopy->deckPointer)
  ;
  std::vector<CardType,_std::allocator<CardType>_>::operator=
            (this->discardPointer,toCopy->discardPointer);
  return;
}

Assistant:

Deck::Deck(const Deck &toCopy) {
    deckSize = new int();
    deckPointer = new vector<CardType>;
    discardPointer = new vector<CardType>;
    *deckSize = *toCopy.deckSize;
    *deckPointer = *toCopy.deckPointer;
    *discardPointer = *toCopy.discardPointer;
}